

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  undefined8 in_RAX;
  stbi_uc *psVar2;
  stbi_uc *psVar3;
  stbi_uc sVar4;
  stbi_uc *psVar5;
  stbi_uc sVar6;
  char c;
  undefined8 uStack_38;
  
  psVar5 = s->img_buffer_original;
  psVar3 = s->img_buffer_original_end;
  s->img_buffer = psVar5;
  s->img_buffer_end = psVar3;
  uStack_38 = in_RAX;
  if (psVar5 < psVar3) {
    s->img_buffer = psVar5 + 1;
    sVar6 = *psVar5;
    psVar5 = psVar5 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    sVar6 = '\0';
  }
  else {
    psVar5 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar3 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar6 = '\0';
    }
    else {
      psVar3 = psVar5 + iVar1;
      sVar6 = *psVar5;
    }
    s->img_buffer_end = psVar3;
    psVar5 = s->buffer_start + 1;
    s->img_buffer = psVar5;
  }
  if (psVar5 < psVar3) {
    psVar2 = psVar5 + 1;
    s->img_buffer = psVar2;
    sVar4 = *psVar5;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_001d82b1;
    psVar5 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar3 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar4 = '\0';
    }
    else {
      psVar3 = psVar5 + iVar1;
      sVar4 = *psVar5;
    }
    s->img_buffer_end = psVar3;
    psVar2 = s->buffer_start + 1;
    s->img_buffer = psVar2;
  }
  if ((sVar6 == 'P') && (0xfd < (byte)(sVar4 - 0x37))) {
    if (comp != (int *)0x0) {
      *comp = (uint)(sVar4 == '6') * 2 + 1;
    }
    if (psVar2 < psVar3) {
      s->img_buffer = psVar2 + 1;
      sVar6 = *psVar2;
    }
    else if (s->read_from_callbacks == 0) {
      sVar6 = '\0';
    }
    else {
      psVar5 = s->buffer_start;
      iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar1 == 0) {
        s->read_from_callbacks = 0;
        psVar3 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar6 = '\0';
      }
      else {
        psVar3 = psVar5 + iVar1;
        sVar6 = *psVar5;
      }
      s->img_buffer_end = psVar3;
      s->img_buffer = s->buffer_start + 1;
    }
    uStack_38 = CONCAT17(sVar6,(undefined7)uStack_38);
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
    iVar1 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
    if (x != (int *)0x0) {
      *x = iVar1;
    }
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
    iVar1 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
    if (y != (int *)0x0) {
      *y = iVar1;
    }
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
    iVar1 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
    if (0xff < iVar1) {
      stbi__g_failure_reason = "max value > 255";
      return 0;
    }
    return 1;
  }
LAB_001d82b1:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}